

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_ResetForNewFrame(ImDrawList *this)

{
  uint *puVar1;
  ImDrawCmd *pIVar2;
  unsigned_short *__src;
  ImDrawVert *__src_00;
  ImVec4 *__src_01;
  void **__src_02;
  ImVec2 *__src_03;
  ImDrawCmd *pIVar3;
  unsigned_short *__dest;
  ImDrawVert *__dest_00;
  ImVec4 *__dest_01;
  void **__dest_02;
  ImVec2 *__dest_03;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  iVar5 = (this->CmdBuffer).Capacity;
  if (iVar5 < 0) {
    uVar4 = iVar5 / 2 + iVar5;
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    pIVar3 = (ImDrawCmd *)ImGui::MemAlloc(uVar8 * 0x38);
    pIVar2 = (this->CmdBuffer).Data;
    if (pIVar2 != (ImDrawCmd *)0x0) {
      memcpy(pIVar3,pIVar2,(long)(this->CmdBuffer).Size * 0x38);
      ImGui::MemFree((this->CmdBuffer).Data);
    }
    (this->CmdBuffer).Data = pIVar3;
    (this->CmdBuffer).Capacity = (int)uVar8;
  }
  (this->CmdBuffer).Size = 0;
  iVar5 = (this->IdxBuffer).Capacity;
  if (iVar5 < 0) {
    iVar5 = iVar5 / 2 + iVar5;
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    __dest = (unsigned_short *)ImGui::MemAlloc((ulong)(uint)(iVar7 * 2));
    __src = (this->IdxBuffer).Data;
    if (__src != (unsigned_short *)0x0) {
      memcpy(__dest,__src,(long)(this->IdxBuffer).Size * 2);
      ImGui::MemFree((this->IdxBuffer).Data);
    }
    (this->IdxBuffer).Data = __dest;
    (this->IdxBuffer).Capacity = iVar7;
  }
  (this->IdxBuffer).Size = 0;
  iVar5 = (this->VtxBuffer).Capacity;
  if (iVar5 < 0) {
    uVar4 = iVar5 / 2 + iVar5;
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    __dest_00 = (ImDrawVert *)ImGui::MemAlloc(uVar8 * 0x14);
    __src_00 = (this->VtxBuffer).Data;
    if (__src_00 != (ImDrawVert *)0x0) {
      memcpy(__dest_00,__src_00,(long)(this->VtxBuffer).Size * 0x14);
      ImGui::MemFree((this->VtxBuffer).Data);
    }
    (this->VtxBuffer).Data = __dest_00;
    (this->VtxBuffer).Capacity = (int)uVar8;
  }
  uVar8 = 0;
  (this->VtxBuffer).Size = 0;
  this->Flags = this->_Data->InitialFlags;
  (this->_CmdHeader).ClipRect.x = 0.0;
  (this->_CmdHeader).ClipRect.y = 0.0;
  (this->_CmdHeader).ClipRect.z = 0.0;
  (this->_CmdHeader).ClipRect.w = 0.0;
  (this->_CmdHeader).TextureId = (ImTextureID)0x0;
  *(undefined8 *)&(this->_CmdHeader).VtxOffset = 0;
  this->_VtxCurrentIdx = 0;
  this->_VtxWritePtr = (ImDrawVert *)SUB168(ZEXT416(0) << 0x40,0);
  this->_IdxWritePtr = (ImDrawIdx *)SUB168(ZEXT416(0) << 0x40,8);
  iVar5 = (this->_ClipRectStack).Capacity;
  if (iVar5 < 0) {
    uVar4 = iVar5 / 2 + iVar5;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    __dest_01 = (ImVec4 *)ImGui::MemAlloc(uVar8 << 4);
    __src_01 = (this->_ClipRectStack).Data;
    if (__src_01 != (ImVec4 *)0x0) {
      memcpy(__dest_01,__src_01,(long)(this->_ClipRectStack).Size << 4);
      ImGui::MemFree((this->_ClipRectStack).Data);
    }
    (this->_ClipRectStack).Data = __dest_01;
    (this->_ClipRectStack).Capacity = (int)uVar8;
  }
  (this->_ClipRectStack).Size = 0;
  iVar5 = (this->_TextureIdStack).Capacity;
  if (iVar5 < 0) {
    uVar4 = iVar5 / 2 + iVar5;
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    __dest_02 = (void **)ImGui::MemAlloc(uVar8 * 8);
    __src_02 = (this->_TextureIdStack).Data;
    if (__src_02 != (void **)0x0) {
      memcpy(__dest_02,__src_02,(long)(this->_TextureIdStack).Size << 3);
      ImGui::MemFree((this->_TextureIdStack).Data);
    }
    (this->_TextureIdStack).Data = __dest_02;
    (this->_TextureIdStack).Capacity = (int)uVar8;
  }
  (this->_TextureIdStack).Size = 0;
  iVar5 = (this->_Path).Capacity;
  if (iVar5 < 0) {
    uVar4 = iVar5 / 2 + iVar5;
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = (ulong)uVar4;
    }
    __dest_03 = (ImVec2 *)ImGui::MemAlloc(uVar8 * 8);
    __src_03 = (this->_Path).Data;
    if (__src_03 != (ImVec2 *)0x0) {
      memcpy(__dest_03,__src_03,(long)(this->_Path).Size << 3);
      ImGui::MemFree((this->_Path).Data);
    }
    (this->_Path).Data = __dest_03;
    (this->_Path).Capacity = (int)uVar8;
  }
  (this->_Path).Size = 0;
  (this->_Splitter)._Current = 0;
  (this->_Splitter)._Count = 1;
  iVar5 = (this->CmdBuffer).Size;
  iVar7 = (this->CmdBuffer).Capacity;
  if (iVar5 == iVar7) {
    iVar5 = iVar5 + 1;
    if (iVar7 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar7 / 2 + iVar7;
    }
    if (iVar5 < iVar6) {
      iVar5 = iVar6;
    }
    if (iVar7 < iVar5) {
      pIVar3 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar5 * 0x38);
      pIVar2 = (this->CmdBuffer).Data;
      if (pIVar2 != (ImDrawCmd *)0x0) {
        memcpy(pIVar3,pIVar2,(long)(this->CmdBuffer).Size * 0x38);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = pIVar3;
      (this->CmdBuffer).Capacity = iVar5;
    }
  }
  pIVar2 = (this->CmdBuffer).Data;
  iVar5 = (this->CmdBuffer).Size;
  pIVar3 = pIVar2 + iVar5;
  puVar1 = &pIVar3->VtxOffset;
  pIVar3->VtxOffset = 0;
  pIVar3->IdxOffset = 0;
  *(undefined8 *)(puVar1 + 2) = 0;
  *(ImDrawCallback *)(puVar1 + 4) = (ImDrawCallback)0x0;
  *(void **)(puVar1 + 6) = (void *)0x0;
  pIVar2 = pIVar2 + iVar5;
  (pIVar2->ClipRect).x = 0.0;
  (pIVar2->ClipRect).y = 0.0;
  (pIVar2->ClipRect).z = 0.0;
  (pIVar2->ClipRect).w = 0.0;
  pIVar2->TextureId = (ImTextureID)0x0;
  pIVar2->VtxOffset = 0;
  pIVar2->IdxOffset = 0;
  (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
  this->_FringeScale = 1.0;
  return;
}

Assistant:

void ImDrawList::_ResetForNewFrame()
{
    // Verify that the ImDrawCmd fields we want to memcmp() are contiguous in memory.
    // (those should be IM_STATIC_ASSERT() in theory but with our pre C++11 setup the whole check doesn't compile with GCC)
    IM_ASSERT(IM_OFFSETOF(ImDrawCmd, ClipRect) == 0);
    IM_ASSERT(IM_OFFSETOF(ImDrawCmd, TextureId) == sizeof(ImVec4));
    IM_ASSERT(IM_OFFSETOF(ImDrawCmd, VtxOffset) == sizeof(ImVec4) + sizeof(ImTextureID));

    CmdBuffer.resize(0);
    IdxBuffer.resize(0);
    VtxBuffer.resize(0);
    Flags = _Data->InitialFlags;
    memset(&_CmdHeader, 0, sizeof(_CmdHeader));
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.resize(0);
    _TextureIdStack.resize(0);
    _Path.resize(0);
    _Splitter.Clear();
    CmdBuffer.push_back(ImDrawCmd());
    _FringeScale = 1.0f;
}